

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmap.cpp
# Opt level: O1

void iCopyColors<cBGRA,cBGRA,bCopy>
               (BYTE *pout,BYTE *pin,int count,int step,FCopyInfo *inf,BYTE tr,BYTE tg,BYTE tb)

{
  BYTE BVar1;
  byte bVar2;
  BYTE BVar3;
  byte bVar4;
  undefined2 uVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  FSpecialColormap *pFVar9;
  EBlend EVar10;
  long lVar11;
  int iVar12;
  BYTE *pBVar13;
  int iVar14;
  uint uVar15;
  long lVar16;
  uint uVar17;
  ulong uVar18;
  
  pFVar9 = SpecialColormaps.Array;
  if (inf == (FCopyInfo *)0x0) {
    EVar10 = BLEND_NONE;
  }
  else {
    EVar10 = inf->blend;
  }
  switch(EVar10) {
  case BLEND_NONE:
    if (0 < count) {
      pBVar13 = pin + 3;
      lVar11 = 0;
      do {
        BVar3 = *pBVar13;
        if (BVar3 != '\0') {
          pout[lVar11 * 4 + 2] = pBVar13[-1];
          pout[lVar11 * 4 + 1] = pBVar13[-2];
          pout[lVar11 * 4] = pBVar13[-3];
          pout[lVar11 * 4 + 3] = BVar3;
        }
        lVar11 = lVar11 + 1;
        pBVar13 = pBVar13 + step;
      } while (count != (int)lVar11);
    }
    break;
  case BLEND_ICEMAP:
    if (0 < count) {
      pBVar13 = pin + 3;
      lVar11 = 0;
      do {
        BVar3 = *pBVar13;
        if (BVar3 != '\0') {
          uVar15 = (uint)pBVar13[-2] * 0x8f + (uint)pBVar13[-1] * 0x4d +
                   ((uint)pBVar13[-3] + (uint)pBVar13[-3] * 8) * 4 >> 0xc;
          BVar1 = IcePalette[uVar15][1];
          pout[lVar11 * 4 + 2] = IcePalette[uVar15][0];
          pout[lVar11 * 4 + 1] = BVar1;
          pout[lVar11 * 4] = IcePalette[uVar15][2];
          pout[lVar11 * 4 + 3] = BVar3;
        }
        lVar11 = lVar11 + 1;
        pBVar13 = pBVar13 + step;
      } while (count != (int)lVar11);
    }
    break;
  case BLEND_OVERLAY:
    if (0 < count) {
      pBVar13 = pin + 3;
      lVar11 = 0;
      do {
        BVar3 = *pBVar13;
        if (BVar3 != '\0') {
          iVar14 = inf->blendcolor[3];
          bVar4 = pBVar13[-2];
          iVar12 = inf->blendcolor[1];
          bVar2 = pBVar13[-3];
          iVar6 = inf->blendcolor[2];
          pout[lVar11 * 4 + 2] = (BYTE)((uint)pBVar13[-1] * iVar14 + inf->blendcolor[0] >> 0x10);
          pout[lVar11 * 4 + 1] = (BYTE)((uint)bVar4 * iVar14 + iVar12 >> 0x10);
          pout[lVar11 * 4] = (BYTE)((uint)bVar2 * iVar14 + iVar6 >> 0x10);
          pout[lVar11 * 4 + 3] = BVar3;
        }
        lVar11 = lVar11 + 1;
        pBVar13 = pBVar13 + step;
      } while (count != (int)lVar11);
    }
    break;
  case BLEND_MODULATE:
    if (0 < count) {
      pBVar13 = pin + 3;
      lVar11 = 0;
      do {
        BVar3 = *pBVar13;
        if (BVar3 != '\0') {
          bVar4 = pBVar13[-2];
          iVar14 = inf->blendcolor[1];
          bVar2 = pBVar13[-3];
          iVar12 = inf->blendcolor[2];
          pout[lVar11 * 4 + 2] = (BYTE)((uint)pBVar13[-1] * inf->blendcolor[0] >> 0x10);
          pout[lVar11 * 4 + 1] = (BYTE)((uint)bVar4 * iVar14 >> 0x10);
          pout[lVar11 * 4] = (BYTE)((uint)bVar2 * iVar12 >> 0x10);
          pout[lVar11 * 4 + 3] = BVar3;
        }
        lVar11 = lVar11 + 1;
        pBVar13 = pBVar13 + step;
      } while (count != (int)lVar11);
    }
    break;
  default:
    EVar10 = inf->blend;
    lVar11 = (long)EVar10;
    if (lVar11 < 0x21) {
      if ((BLEND_ICEMAP < EVar10) && (0 < count)) {
        iVar14 = 0x20 - EVar10;
        pBVar13 = pin + 3;
        lVar11 = 0;
        do {
          BVar3 = *pBVar13;
          if (BVar3 != '\0') {
            bVar4 = pBVar13[-3];
            iVar12 = ((uint)pBVar13[-2] * 0x8f + (uint)pBVar13[-1] * 0x4d +
                      ((uint)bVar4 + (uint)bVar4 * 8) * 4 >> 8) * (EVar10 + BLEND_MODULATE);
            lVar16 = (long)(int)((uint)pBVar13[-1] * iVar14 + iVar12) * 0x84210843;
            lVar7 = (long)(int)((uint)pBVar13[-2] * iVar14 + iVar12) * 0x84210843;
            lVar8 = (long)(int)((uint)bVar4 * iVar14 + iVar12) * 0x84210843;
            pout[lVar11 * 4 + 2] = (char)(uint)((ulong)lVar16 >> 0x24) - (char)(lVar16 >> 0x3f);
            pout[lVar11 * 4 + 1] = (char)(uint)((ulong)lVar7 >> 0x24) - (char)(lVar7 >> 0x3f);
            pout[lVar11 * 4] = (char)(uint)((ulong)lVar8 >> 0x24) - (char)(lVar8 >> 0x3f);
            pout[lVar11 * 4 + 3] = BVar3;
          }
          lVar11 = lVar11 + 1;
          pBVar13 = pBVar13 + step;
        } while (count != (int)lVar11);
      }
    }
    else if (0 < count) {
      pBVar13 = pin + 3;
      lVar16 = 0;
      do {
        BVar3 = *pBVar13;
        if (BVar3 != '\0') {
          uVar15 = (uint)pBVar13[-2] * 0x8f + (uint)pBVar13[-1] * 0x4d +
                   ((uint)pBVar13[-3] + (uint)pBVar13[-3] * 8) * 4;
          uVar17 = uVar15 >> 8;
          if (0xfe < uVar17) {
            uVar17 = 0xff;
          }
          uVar18 = (ulong)uVar17;
          if (uVar15 < 0x100) {
            uVar18 = 0;
          }
          uVar5 = *(undefined2 *)((long)pFVar9 + uVar18 * 4 + lVar11 * 0x518 + -0xa700);
          pout[lVar16 * 4 + 2] = *(BYTE *)((long)pFVar9 + uVar18 * 4 + lVar11 * 0x518 + -0xa6fe);
          *(undefined2 *)(pout + lVar16 * 4) = uVar5;
          pout[lVar16 * 4 + 3] = BVar3;
        }
        lVar16 = lVar16 + 1;
        pBVar13 = pBVar13 + step;
      } while (count != (int)lVar16);
    }
  }
  return;
}

Assistant:

void iCopyColors(BYTE *pout, const BYTE *pin, int count, int step, FCopyInfo *inf,
	BYTE tr, BYTE tg, BYTE tb)
{
	int i;
	int fac;
	BYTE r,g,b;
	int gray;
	int a;

	switch(inf? inf->blend : BLEND_NONE)
	{
	case BLEND_NONE:
		for(i=0;i<count;i++)
		{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				TBlend::OpC(pout[TDest::RED], TSrc::R(pin), a, inf);
				TBlend::OpC(pout[TDest::GREEN], TSrc::G(pin), a, inf);
				TBlend::OpC(pout[TDest::BLUE], TSrc::B(pin), a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	case BLEND_ICEMAP:
		// Create the ice translation table, based on Hexen's.
		// Since this is done in True Color the purplish tint is fully preserved - even in Doom!
		for(i=0;i<count;i++)
		{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				int gray = TSrc::Gray(pin)>>4;
	
				TBlend::OpC(pout[TDest::RED],   IcePalette[gray][0], a, inf);
				TBlend::OpC(pout[TDest::GREEN], IcePalette[gray][1], a, inf);
				TBlend::OpC(pout[TDest::BLUE],  IcePalette[gray][2], a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	default:

		if (inf->blend >= BLEND_SPECIALCOLORMAP1)
		{
			FSpecialColormap *cm = &SpecialColormaps[inf->blend - BLEND_SPECIALCOLORMAP1];
			for(i=0;i<count;i++)
			{
				a = TSrc::A(pin, tr, tg, tb);
				if (TBlend::ProcessAlpha0() || a)
				{
					gray = clamp<int>(TSrc::Gray(pin),0,255);

					PalEntry pe = cm->GrayscaleToColor[gray];
					TBlend::OpC(pout[TDest::RED], pe.r , a, inf);
					TBlend::OpC(pout[TDest::GREEN], pe.g, a, inf);
					TBlend::OpC(pout[TDest::BLUE], pe.b, a, inf);
					TBlend::OpA(pout[TDest::ALPHA], a, inf);
				}
				pout+=4;
				pin+=step;
			}
		}
		else if (inf->blend >= BLEND_DESATURATE1 && inf->blend<=BLEND_DESATURATE31)
		{
			// Desaturated light settings.
			fac=inf->blend-BLEND_DESATURATE1+1;
			for(i=0;i<count;i++)
			{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
				{
					gray = TSrc::Gray(pin);
					r = (TSrc::R(pin)*(31-fac) + gray*fac)/31;
					g = (TSrc::G(pin)*(31-fac) + gray*fac)/31;
					b = (TSrc::B(pin)*(31-fac) + gray*fac)/31;

					TBlend::OpC(pout[TDest::RED],   r, a, inf);
					TBlend::OpC(pout[TDest::GREEN], g, a, inf);
					TBlend::OpC(pout[TDest::BLUE],  b, a, inf);
					TBlend::OpA(pout[TDest::ALPHA], a, inf);
				}
				pout+=4;
				pin+=step;
			}
		}
		break;

	case BLEND_MODULATE:
		for(i=0;i<count;i++)
		{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				r = (TSrc::R(pin)*inf->blendcolor[0])>>BLENDBITS;
				g = (TSrc::G(pin)*inf->blendcolor[1])>>BLENDBITS;
				b = (TSrc::B(pin)*inf->blendcolor[2])>>BLENDBITS;

				TBlend::OpC(pout[TDest::RED],   r, a, inf);
				TBlend::OpC(pout[TDest::GREEN], g, a, inf);
				TBlend::OpC(pout[TDest::BLUE],  b, a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	case BLEND_OVERLAY:
		for(i=0;i<count;i++)
		{
			// color blend
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				r = (TSrc::R(pin)*inf->blendcolor[3] + inf->blendcolor[0]) >> BLENDBITS;
				g = (TSrc::G(pin)*inf->blendcolor[3] + inf->blendcolor[1]) >> BLENDBITS;
				b = (TSrc::B(pin)*inf->blendcolor[3] + inf->blendcolor[2]) >> BLENDBITS;

				TBlend::OpC(pout[TDest::RED],   r, a, inf);
				TBlend::OpC(pout[TDest::GREEN], g, a, inf);
				TBlend::OpC(pout[TDest::BLUE],  b, a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	}
}